

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int b;
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  int *piVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  stbi__result_info *in_R9;
  ulong uVar7;
  float *pfVar8;
  float *pfVar9;
  uint uVar10;
  ulong uVar11;
  float *pfVar12;
  long lVar13;
  uchar *puVar14;
  float fVar15;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar3 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      iVar5 = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = (float *)stbi__malloc_mad4(iVar5,b,req_comp,(int)piVar3,iVar1);
      if (pfVar2 != (float *)0x0) {
        uVar6 = b * iVar5;
        if (0 < (int)uVar6) {
          uVar10 = (req_comp + (req_comp & 1U)) - 1;
          lVar4 = (long)req_comp;
          uVar7 = 0;
          pfVar8 = pfVar2;
          puVar14 = __ptr;
          do {
            uVar11 = 0;
            if (0 < (int)uVar10) {
              uVar11 = 0;
              do {
                fVar15 = powf((float)puVar14[uVar11] / 255.0,stbi__l2h_gamma);
                pfVar8[uVar11] = fVar15 * stbi__l2h_scale;
                uVar11 = uVar11 + 1;
              } while (uVar10 != uVar11);
            }
            if ((int)uVar11 < req_comp) {
              lVar13 = (long)(int)uVar11 + uVar7 * lVar4;
              pfVar2[lVar13] = (float)__ptr[lVar13] / 255.0;
            }
            uVar7 = uVar7 + 1;
            pfVar8 = pfVar8 + lVar4;
            puVar14 = puVar14 + lVar4;
          } while (uVar7 != uVar6);
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if ((pfVar2 != (float *)0x0) && (stbi__vertically_flip_on_load != 0)) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar6 = *y >> 1;
      if (0 < (int)uVar6) {
        iVar1 = *x;
        lVar4 = (long)req_comp;
        iVar5 = (*y + -1) * iVar1;
        uVar7 = 0;
        pfVar8 = pfVar2;
        do {
          if (0 < iVar1) {
            pfVar9 = (float *)((long)iVar5 * lVar4 * 4 + (long)pfVar2);
            lVar13 = 0;
            pfVar12 = pfVar8;
            do {
              if (0 < req_comp) {
                uVar11 = 0;
                do {
                  fVar15 = pfVar12[uVar11];
                  pfVar12[uVar11] = pfVar9[uVar11];
                  pfVar9[uVar11] = fVar15;
                  uVar11 = uVar11 + 1;
                } while ((uint)req_comp != uVar11);
              }
              lVar13 = lVar13 + 1;
              pfVar9 = pfVar9 + lVar4;
              pfVar12 = pfVar12 + lVar4;
            } while (lVar13 != iVar1);
          }
          uVar7 = uVar7 + 1;
          iVar5 = iVar5 - iVar1;
          pfVar8 = pfVar8 + lVar4 * iVar1;
        } while (uVar7 != uVar6);
      }
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}